

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

size_t Catch::listTags(Config *config)

{
  size_type *psVar1;
  pointer *__return_storage_ptr__;
  char *pcVar2;
  pointer pTVar3;
  pointer pbVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  IRegistryHub *pIVar6;
  undefined4 extraout_var_01;
  undefined1 auVar7 [8];
  iterator iVar8;
  TextAttributes *pTVar9;
  _Rb_tree_node_base *p_Var10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  pointer pbVar13;
  pointer *ppbVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_bool>
  pVar15;
  undefined1 local_2d0 [8];
  ostringstream oss;
  char local_2c0 [8];
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined1 local_298 [24];
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> vStack_280;
  TagAliasRegistry *local_268;
  ios_base local_260 [264];
  undefined1 *local_158;
  pointer local_150;
  undefined1 local_148 [16];
  undefined1 auStack_138 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  undefined1 auStack_f8 [8];
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TestSpec testSpec;
  string lcaseTagName;
  Text wrapper;
  string tagName;
  
  iVar5 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             &matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar5));
  iVar5 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar5) == ((long *)CONCAT44(extraout_var_00,iVar5))[1]) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"All available tags:\n",0x14);
    TagAliasRegistry::get();
    local_2b8._8_8_ = 0;
    local_2a8._M_allocated_capacity._0_4_ = local_2a8._M_allocated_capacity._0_4_ & 0xffffff00;
    local_298._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_298._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_298._16_8_ = (pointer)0x0;
    vStack_280.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_280.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_280.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_268 = &TagAliasRegistry::get::instance;
    psVar1 = &wrapper.str._M_string_length;
    local_2b8._0_8_ = &local_2a8;
    lcaseTagName.field_2._8_8_ = psVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&lcaseTagName.field_2 + 8),"*","");
    this = TestSpecParser::parse
                     ((TestSpecParser *)local_2d0,(string *)((long)&lcaseTagName.field_2 + 8));
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &wrapper.lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&(this->m_testSpec).m_filters);
    tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         testSpec.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    tagCounts._M_t._M_impl._0_8_ =
         testSpec.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    auStack_138 = (undefined1  [8])
                  matchedTestCases.
                  super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)wrapper.lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)tagName._M_dataplus._M_p;
    testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)tagName._M_string_length;
    wrapper.lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tagName._M_dataplus._M_p = (pointer)0x0;
    tagName._M_string_length = 0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               auStack_138);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &wrapper.lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((size_type *)lcaseTagName.field_2._8_8_ != psVar1) {
      operator_delete((void *)lcaseTagName.field_2._8_8_);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&vStack_280);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
               *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._0_8_ != &local_2a8) {
      operator_delete((void *)local_2b8._0_8_);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Tags for matching test cases:\n",0x1e);
  }
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tagCounts;
  tagCounts._M_t._M_impl._0_8_ = tagCounts._M_t._M_impl._0_8_ & 0xffffffff00000000;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_f8 = (undefined1  [8])0x0;
  matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  pIVar6 = getRegistryHub();
  iVar5 = (*pIVar6->_vptr_IRegistryHub[3])(pIVar6);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x18))
            ((long *)CONCAT44(extraout_var_01,iVar5),
             &matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,config,auStack_f8,0);
  pTVar3 = matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (auStack_f8 !=
      (undefined1  [8])
      matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
      .super__Vector_impl_data._M_start) {
    ppbVar14 = &wrapper.lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __return_storage_ptr__ =
         &testSpec.m_filters.
          super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
    auVar7 = auStack_f8;
    do {
      tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)auVar7;
      for (p_Var10 = (((pointer)auVar7)->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header
                     ._M_header._M_left;
          (_Rb_tree_header *)p_Var10 !=
          &(((pointer)auVar7)->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        wrapper.lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&tagName._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)ppbVar14,*(long *)(p_Var10 + 1),
                   (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
        toLower((string *)__return_storage_ptr__,(string *)ppbVar14);
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                        *)auStack_138,(key_type *)__return_storage_ptr__);
        if (iVar8._M_node == (_Base_ptr)&tagCounts) {
          wrapper.str._M_dataplus._M_p._0_4_ = 0;
          wrapper.str._M_string_length = 0;
          wrapper.str.field_2._M_allocated_capacity = (size_type)&wrapper;
          wrapper.attr.initialIndent = 0;
          wrapper.attr.indent = 0;
          local_2d0 = (undefined1  [8])local_2c0;
          wrapper.str.field_2._8_8_ = wrapper.str.field_2._M_allocated_capacity;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2d0,
                     testSpec.m_filters.
                     super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     lcaseTagName._M_dataplus._M_p +
                     (long)testSpec.m_filters.
                           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (wrapper.str._M_string_length == 0) {
            local_2a8._M_allocated_capacity._0_4_ = 0;
            local_2a8._8_8_ = 0;
            local_298._0_8_ = &local_2a8;
            pTVar9 = (TextAttributes *)(local_298 + 0x10);
            local_298._8_8_ = local_298._0_8_;
          }
          else {
            local_2a8._M_allocated_capacity._0_4_ = (uint)wrapper.str._M_dataplus._M_p;
            local_2a8._8_8_ = wrapper.str._M_string_length;
            local_298._0_8_ = wrapper.str.field_2._M_allocated_capacity;
            local_298._8_8_ = wrapper.str.field_2._8_8_;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)(wrapper.str._M_string_length + 8) = &local_2a8;
            local_298._16_8_ = wrapper.attr.initialIndent;
            wrapper.str._M_string_length = 0;
            wrapper.str.field_2._M_allocated_capacity = (size_type)&wrapper;
            pTVar9 = &wrapper.attr;
            wrapper.str.field_2._8_8_ = wrapper.str.field_2._M_allocated_capacity;
          }
          pTVar9->initialIndent = 0;
          vStack_280.
          super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)wrapper.attr.indent;
          pVar15 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                   ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagInfo>>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                               *)auStack_138,
                              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                               *)local_2d0);
          iVar8._M_node = (_Base_ptr)pVar15.first._M_node;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_2b8 + 8));
          if (local_2d0 != (undefined1  [8])local_2c0) {
            operator_delete((void *)local_2d0);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&lcaseTagName.field_2 + 8));
        }
        iVar8._M_node[3]._M_left = (_Base_ptr)((long)&(iVar8._M_node[3]._M_left)->_M_color + 1);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)(iVar8._M_node + 2),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppbVar14);
        if (testSpec.m_filters.
            super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage !=
            (pointer)&lcaseTagName._M_string_length) {
          operator_delete(testSpec.m_filters.
                          super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (wrapper.lines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&tagName._M_string_length
           ) {
          operator_delete(wrapper.lines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      auVar7 = (undefined1  [8])(tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x118)
      ;
    } while (auVar7 != (undefined1  [8])pTVar3);
  }
  if (tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&tagCounts) {
    p_Var12 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      ppbVar14 = &wrapper.lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d0,"  ",2);
      pcVar2 = local_2c0 + *(long *)((long)local_2d0 + -0x18);
      pcVar2[0] = '\x02';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = '\0';
      pcVar2[5] = '\0';
      pcVar2[6] = '\0';
      pcVar2[7] = '\0';
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_2d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"  ",2);
      TagInfo::all_abi_cxx11_((string *)ppbVar14,(TagInfo *)(p_Var12 + 2));
      lcaseTagName._M_string_length = 0x4f;
      lcaseTagName.field_2._M_local_buf[0] = '\t';
      testSpec.m_filters.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lcaseTagName._M_dataplus._M_p = (pointer)0x0;
      std::__cxx11::stringbuf::str();
      lcaseTagName._M_dataplus._M_p = local_150;
      lcaseTagName._M_string_length = 0x46;
      Tbc::Text::Text((Text *)((long)&lcaseTagName.field_2 + 8),(string *)ppbVar14,
                      (TextAttributes *)
                      &testSpec.m_filters.
                       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (local_158 != local_148) {
        operator_delete(local_158);
      }
      if (wrapper.lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&tagName._M_string_length)
      {
        operator_delete(wrapper.lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::__cxx11::stringbuf::str();
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           (char *)wrapper.lines.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (long)tagName._M_dataplus._M_p);
      pbVar4 = wrapper.lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pbVar13 = (pointer)wrapper.attr._24_8_; pbVar13 != pbVar4; pbVar13 = pbVar13 + 1) {
        if (pbVar13 != (pointer)wrapper.attr._24_8_) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      if (wrapper.lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&tagName._M_string_length)
      {
        operator_delete(wrapper.lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&wrapper.attr.tabChar);
      if ((size_type *)lcaseTagName.field_2._8_8_ != &wrapper.str._M_string_length) {
        operator_delete((void *)lcaseTagName.field_2._8_8_);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
      std::ios_base::~ios_base(local_260);
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != (_Rb_tree_node_base *)&tagCounts);
  }
  p_Var12 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  psVar1 = &wrapper.str._M_string_length;
  lcaseTagName.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&lcaseTagName.field_2 + 8),"tag","");
  local_2d0 = (undefined1  [8])p_Var12;
  _oss = local_2b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&oss,lcaseTagName.field_2._8_8_,
             CONCAT44(wrapper.str._M_dataplus._M_p._4_4_,(uint)wrapper.str._M_dataplus._M_p) +
             lcaseTagName.field_2._8_8_);
  operator<<((ostream *)&std::cout,(pluralise *)local_2d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  if (_oss != local_2b8) {
    operator_delete(_oss);
  }
  if ((size_type *)lcaseTagName.field_2._8_8_ != psVar1) {
    operator_delete((void *)lcaseTagName.field_2._8_8_);
  }
  p_Var12 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)auStack_f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
               *)auStack_138);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             &matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (size_t)p_Var12;
}

Assistant:

inline std::size_t listTags( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases;
        getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, config, matchedTestCases );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            for( std::set<std::string>::const_iterator  tagIt = it->getTestCaseInfo().tags.begin(),
                                                        tagItEnd = it->getTestCaseInfo().tags.end();
                    tagIt != tagItEnd;
                    ++tagIt ) {
                std::string tagName = *tagIt;
                std::string lcaseTagName = toLower( tagName );
                std::map<std::string, TagInfo>::iterator countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( std::map<std::string, TagInfo>::const_iterator countIt = tagCounts.begin(),
                                                            countItEnd = tagCounts.end();
                countIt != countItEnd;
                ++countIt ) {
            std::ostringstream oss;
            oss << "  " << std::setw(2) << countIt->second.count << "  ";
            Text wrapper( countIt->second.all(), TextAttributes()
                                                    .setInitialIndent( 0 )
                                                    .setIndent( oss.str().size() )
                                                    .setWidth( CATCH_CONFIG_CONSOLE_WIDTH-10 ) );
            Catch::cout() << oss.str() << wrapper << "\n";
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << "\n" << std::endl;
        return tagCounts.size();
    }